

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_subset_seq_parameter_set_rbsp(sps_subset_t *sps_subset,bs_t *b)

{
  sps_svc_ext_t *sps_svc_ext;
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  _Bool _Var6;
  
  read_seq_parameter_set_rbsp(sps_subset->sps,b);
  iVar2 = sps_subset->sps->profile_idc;
  if ((iVar2 == 0x56) || (iVar2 == 0x53)) {
    read_seq_parameter_set_svc_extension(sps_subset,b);
    sps_svc_ext = (sps_subset->field_1).sps_svc_ext;
    uVar3 = b->bits_left - 1;
    b->bits_left = uVar3;
    pbVar4 = b->p;
    bVar5 = false;
    if (pbVar4 < b->end) {
      bVar5 = (*pbVar4 >> (uVar3 & 0x1f) & 1) != 0;
    }
    if (uVar3 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    sps_svc_ext->svc_vui_parameters_present_flag = bVar5;
    if (bVar5) {
      read_svc_vui_parameters_extension(sps_svc_ext,b);
    }
  }
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar4 = b->p;
  pbVar1 = b->end;
  bVar5 = false;
  if (pbVar4 < pbVar1) {
    bVar5 = (*pbVar4 >> (uVar3 & 0x1f) & 1) != 0;
  }
  if (uVar3 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps_subset->additional_extension2_flag = bVar5;
  if (bVar5) {
    iVar2 = more_rbsp_data(b);
    if (iVar2 != 0) {
      uVar3 = b->bits_left;
      pbVar4 = b->p;
      do {
        uVar3 = uVar3 - 1;
        b->bits_left = uVar3;
        if (pbVar4 < pbVar1) {
          _Var6 = (*pbVar4 >> (uVar3 & 0x1f) & 1) != 0;
        }
        else {
          _Var6 = false;
        }
        if (uVar3 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar3 = 8;
        }
        sps_subset->additional_extension2_flag = _Var6;
        iVar2 = more_rbsp_data(b);
      } while (iVar2 != 0);
    }
  }
  return;
}

Assistant:

void read_subset_seq_parameter_set_rbsp(sps_subset_t* sps_subset, bs_t* b)
{
    read_seq_parameter_set_rbsp(sps_subset->sps, b);
    
    switch( sps_subset->sps->profile_idc )
    {
        case 83:
        case 86:
            read_seq_parameter_set_svc_extension(sps_subset, b); /* specified in Annex G */
            
            sps_svc_ext_t* sps_svc_ext = sps_subset->sps_svc_ext;
            sps_svc_ext->svc_vui_parameters_present_flag = bs_read_u1(b);
            
            if( sps_svc_ext->svc_vui_parameters_present_flag )
            {
                read_svc_vui_parameters_extension(sps_svc_ext,b); /* specified in Annex G */
            }
            break;
        default:
            break;
    }
    sps_subset->additional_extension2_flag = bs_read_u1(b);
    if( sps_subset->additional_extension2_flag )
    {
        while( more_rbsp_data( b ) )
        {
            sps_subset->additional_extension2_flag = bs_read_u1(b);
        }
    }
    
}